

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<DataStream,std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>
               (DataStream *os,
               pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *item)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,unsigned_char,secure_allocator<unsigned_char>>(os,&item->first);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    base_blob<256U>::Serialize<DataStream>(&(item->second).super_base_blob<256U>,os);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}